

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void cbtCollisionWorld::rayTestSingleInternal
               (cbtTransform *rayFromTrans,cbtTransform *rayToTrans,
               cbtCollisionObjectWrapper *collisionObjectWrap,RayResultCallback *resultCallback)

{
  cbtScalar cVar1;
  cbtScalar cVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  cbtCompoundShape *this;
  cbtTransform *this_00;
  cbtCollisionObject *pcVar8;
  cbtCompoundShape *this_01;
  float fVar9;
  float fVar10;
  float fVar11;
  cbtVector3 cVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  float *pfVar16;
  int i;
  cbtGjkConvexCast *pcVar17;
  cbtBvhTriangleMeshShape *triangleMesh;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  cbtVector3 rayAabbMaxLocal;
  cbtVector3 rayAabbMinLocal;
  cbtVector3 rayToLocal_1;
  cbtVector3 rayToLocalScaled;
  cbtGjkConvexCast gjkConvexCaster;
  cbtSubsimplexConvexCast subSimplexConvexCaster;
  LocalRayResult localRayResult;
  CastResult castResult;
  cbtVoronoiSimplexSolver simplexSolver;
  float local_378;
  cbtScalar cStack_374;
  float fStack_370;
  cbtScalar cStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  cbtTransform *local_358;
  cbtVector3 local_350;
  cbtVector3 local_340;
  undefined1 local_330 [8];
  float fStack_328;
  undefined1 local_310 [8];
  float fStack_308;
  cbtVector3 local_2f0;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  float local_2d0;
  float local_2cc;
  uint local_2c8;
  float local_2c0;
  float local_2bc;
  float local_2b8;
  cbtCollisionObjectWrapper *local_2b0;
  cbtVector3 local_2a8;
  uint local_298;
  float local_294;
  uint local_290;
  uint local_288;
  float local_284;
  uint local_280;
  float local_278;
  float local_274;
  float local_270;
  float local_220;
  float fStack_21c;
  float fStack_218;
  undefined4 uStack_214;
  cbtScalar local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  undefined1 local_1e0 [16];
  cbtCompoundShape *local_1d0;
  cbtTransform *local_1c8;
  cbtTransform *local_1c0;
  undefined8 local_1b8;
  RayResultCallback *local_1b0;
  cbtCollisionObject *local_1a8;
  cbtCompoundShape *local_1a0;
  cbtScalar local_198 [4];
  cbtScalar local_188 [2];
  cbtVector3 cStack_180;
  cbtVector3 cStack_170;
  cbtVector3 acStack_160 [11];
  cbtScalar local_ac;
  byte local_94;
  cbtConvexInternalShape local_78;
  undefined4 extraout_var;
  
  cbtConvexInternalShape::cbtConvexInternalShape(&local_78);
  local_78.super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtConvexShape_00b72170;
  local_78.super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 8;
  local_78.super_cbtConvexShape.super_cbtCollisionShape._28_4_ = 0x3f800000;
  local_78._32_4_ = 0x3f800000;
  local_78._36_4_ = 0x3f800000;
  local_78._40_4_ = 0;
  local_78.m_implicitShapeDimensions.m_floats[0] = 0.0;
  local_78.m_implicitShapeDimensions.m_floats[1] = 0.0;
  local_78.m_implicitShapeDimensions.m_floats[2] = 0.0;
  local_78.m_implicitShapeDimensions.m_floats[3] = 0.0;
  local_78.m_collisionMargin = 0.0;
  local_78.m_padding = 0.0;
  this = (cbtCompoundShape *)collisionObjectWrap->m_shape;
  this_00 = collisionObjectWrap->m_worldTransform;
  iVar15 = (((cbtTriangleMeshShape *)&this->super_cbtCollisionShape)->super_cbtConcaveShape).
           super_cbtCollisionShape.m_shapeType;
  if (iVar15 < 0x18) {
    local_2a8.m_floats._0_8_ = &PTR_DebugDraw_00b6ffb0;
    local_1f8 = 0;
    local_1f0 = 0x2000000000;
    local_1e8 = 0x38d1b717;
    local_200 = resultCallback->m_closestHitFraction;
    local_ac = 0.0001;
    local_94 = local_94 & 0xf0;
    local_358 = this_00;
    local_2b0 = collisionObjectWrap;
    cbtSubsimplexConvexCast::cbtSubsimplexConvexCast
              ((cbtSubsimplexConvexCast *)local_310,&local_78.super_cbtConvexShape,
               (cbtConvexShape *)this,(cbtVoronoiSimplexSolver *)local_1e0);
    cbtGjkConvexCast::cbtGjkConvexCast
              ((cbtGjkConvexCast *)local_330,&local_78.super_cbtConvexShape,(cbtConvexShape *)this,
               (cbtVoronoiSimplexSolver *)local_1e0);
    pcVar17 = (cbtGjkConvexCast *)local_330;
    if ((resultCallback->m_flags & 8) == 0) {
      pcVar17 = (cbtGjkConvexCast *)local_310;
    }
    iVar15 = (*(((cbtSubsimplexConvexCast *)pcVar17)->super_cbtConvexCast)._vptr_cbtConvexCast[2])
                       (pcVar17,rayFromTrans,rayToTrans,local_358,local_358,&local_2a8);
    if ((char)iVar15 != '\0') {
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fStack_21c * fStack_21c)),ZEXT416((uint)local_220),
                                ZEXT416((uint)local_220));
      auVar20 = vfmadd213ss_fma(ZEXT416((uint)fStack_218),ZEXT416((uint)fStack_218),auVar20);
      fVar18 = auVar20._0_4_;
      if ((0.0001 < fVar18) && (local_200 < resultCallback->m_closestHitFraction)) {
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          auVar20 = vsqrtss_avx(auVar20,auVar20);
          fVar18 = auVar20._0_4_;
        }
        fVar18 = 1.0 / fVar18;
        local_220 = fVar18 * local_220;
        fStack_21c = fVar18 * fStack_21c;
        fStack_218 = fVar18 * fStack_218;
        local_2f0.m_floats[2] = 0.0;
        local_2f0.m_floats[3] = 0.0;
        local_2f0.m_floats._0_8_ = local_2b0->m_collisionObject;
        local_2e0 = CONCAT44(fStack_21c,local_220);
        uStack_2d8 = CONCAT44(uStack_214,fStack_218);
        local_2d0 = local_200;
        (*resultCallback->_vptr_RayResultCallback[3])(resultCallback,&local_2f0,1);
      }
    }
    cbtConvexCast::~cbtConvexCast((cbtConvexCast *)local_330);
    cbtConvexCast::~cbtConvexCast((cbtConvexCast *)local_310);
  }
  else if (iVar15 - 0x19U < 0xb) {
    cbtTransform::inverse(this_00);
    cVar1 = (rayFromTrans->m_origin).m_floats[0];
    fVar18 = (rayFromTrans->m_origin).m_floats[1];
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * local_2a8.m_floats[1])),ZEXT416((uint)cVar1),
                              ZEXT416((uint)local_2a8.m_floats[0]));
    cVar2 = (rayFromTrans->m_origin).m_floats[2];
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar2),ZEXT416((uint)local_2a8.m_floats[2]));
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_294 * fVar18)),ZEXT416((uint)cVar1),
                              ZEXT416(local_298));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar2),ZEXT416(local_290));
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_284 * fVar18)),ZEXT416(local_288),
                              ZEXT416((uint)cVar1));
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416(local_280),ZEXT416((uint)cVar2));
    auVar20 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ + local_278)),
                            ZEXT416((uint)(auVar19._0_4_ + local_274)),0x10);
    _local_310 = (cbtScalar  [4])
                 vinsertps_avx(auVar20,ZEXT416((uint)(local_270 + auVar21._0_4_)),0x28);
    cVar1 = (rayToTrans->m_origin).m_floats[0];
    fVar18 = (rayToTrans->m_origin).m_floats[1];
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_2a8.m_floats[1] * fVar18)),ZEXT416((uint)cVar1),
                              ZEXT416((uint)local_2a8.m_floats[0]));
    cVar2 = (rayToTrans->m_origin).m_floats[2];
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar2),ZEXT416((uint)local_2a8.m_floats[2]));
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_294 * fVar18)),ZEXT416((uint)cVar1),
                              ZEXT416(local_298));
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar2),ZEXT416(local_290));
    auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_284 * fVar18)),ZEXT416((uint)cVar1),
                              ZEXT416(local_288));
    auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar2),ZEXT416(local_280));
    auVar20 = vinsertps_avx(ZEXT416((uint)(local_278 + auVar20._0_4_)),
                            ZEXT416((uint)(local_274 + auVar19._0_4_)),0x10);
    _local_330 = (cbtScalar  [4])
                 vinsertps_avx(auVar20,ZEXT416((uint)(local_270 + auVar21._0_4_)),0x28);
    iVar15 = (((cbtTriangleMeshShape *)&this->super_cbtCollisionShape)->super_cbtConcaveShape).
             super_cbtCollisionShape.m_shapeType;
    if (iVar15 == 0x1a) {
      this_01 = *(cbtCompoundShape **)((cbtVector3 *)&(this->m_children).m_data)->m_floats;
      iVar15 = (*(((cbtTriangleMeshShape *)&this->super_cbtCollisionShape)->super_cbtConcaveShape).
                 super_cbtCollisionShape._vptr_cbtCollisionShape[7])(this);
      pfVar16 = (float *)CONCAT44(extraout_var,iVar15);
      auVar20._0_4_ = (float)local_310._0_4_ / *pfVar16;
      auVar20._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar21._0_4_ = (float)local_310._4_4_ / pfVar16[1];
      auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar20 = vinsertps_avx(auVar20,auVar21,0x10);
      auVar22._0_4_ = fStack_308 / pfVar16[2];
      auVar22._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_2f0.m_floats = (cbtScalar  [4])vinsertps_avx(auVar20,auVar22,0x28);
      auVar20 = vinsertps_avx(ZEXT416((uint)((float)local_330._0_4_ / *pfVar16)),
                              ZEXT416((uint)((float)local_330._4_4_ / pfVar16[1])),0x10);
      auVar19._0_4_ = fStack_328 / pfVar16[2];
      auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
      local_340.m_floats = (cbtScalar  [4])vinsertps_avx(auVar20,auVar19,0x28);
      pcVar8 = collisionObjectWrap->m_collisionObject;
      cbtTriangleRaycastCallback::cbtTriangleRaycastCallback
                ((cbtTriangleRaycastCallback *)local_1e0,&local_2f0,&local_340,
                 resultCallback->m_flags);
      local_1e0._0_8_ = &PTR__cbtTriangleCallback_00b6fd40;
      local_198._0_8_ = *(undefined8 *)(this_00->m_basis).m_el[0].m_floats;
      local_198[2] = (this_00->m_basis).m_el[0].m_floats[2];
      local_198[3] = (this_00->m_basis).m_el[0].m_floats[3];
      local_188 = *(cbtScalar (*) [2])(this_00->m_basis).m_el[1].m_floats;
      cStack_180.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[1].m_floats + 2);
      cStack_180.m_floats._8_8_ = *(undefined8 *)(this_00->m_basis).m_el[2].m_floats;
      cStack_170.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[2].m_floats + 2);
      cStack_170.m_floats._8_8_ = *(undefined8 *)(this_00->m_origin).m_floats;
      acStack_160[0].m_floats._0_8_ = *(undefined8 *)((this_00->m_origin).m_floats + 2);
      local_1b8 = (cbtTransform *)
                  CONCAT44(resultCallback->m_closestHitFraction,(cbtScalar)local_1b8);
      local_1b0 = resultCallback;
      local_1a8 = pcVar8;
      local_1a0 = this_01;
      cbtBvhTriangleMeshShape::performRaycast
                ((cbtBvhTriangleMeshShape *)this_01,(cbtTriangleCallback *)local_1e0,&local_2f0,
                 &local_340);
    }
    else {
      local_1a0 = this;
      if (iVar15 == 0x19) {
        pcVar8 = collisionObjectWrap->m_collisionObject;
        cbtTriangleRaycastCallback::cbtTriangleRaycastCallback
                  ((cbtTriangleRaycastCallback *)local_1e0,(cbtVector3 *)local_310,
                   (cbtVector3 *)local_330,resultCallback->m_flags);
        local_1e0._0_8_ = &PTR__cbtTriangleCallback_00b6fd40;
        local_198._0_8_ = *(undefined8 *)(this_00->m_basis).m_el[0].m_floats;
        local_198[2] = (this_00->m_basis).m_el[0].m_floats[2];
        local_198[3] = (this_00->m_basis).m_el[0].m_floats[3];
        local_188 = *(cbtScalar (*) [2])(this_00->m_basis).m_el[1].m_floats;
        cStack_180.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[1].m_floats + 2);
        cStack_180.m_floats._8_8_ = *(undefined8 *)(this_00->m_basis).m_el[2].m_floats;
        cStack_170.m_floats._0_8_ = *(undefined8 *)((this_00->m_basis).m_el[2].m_floats + 2);
        cStack_170.m_floats._8_8_ = *(undefined8 *)(this_00->m_origin).m_floats;
        acStack_160[0].m_floats._0_8_ = *(undefined8 *)((this_00->m_origin).m_floats + 2);
        local_1b8 = (cbtTransform *)
                    CONCAT44(resultCallback->m_closestHitFraction,(cbtScalar)local_1b8);
        local_1b0 = resultCallback;
        local_1a8 = pcVar8;
        cbtBvhTriangleMeshShape::performRaycast
                  ((cbtBvhTriangleMeshShape *)this,(cbtTriangleCallback *)local_1e0,
                   (cbtVector3 *)local_310,(cbtVector3 *)local_330);
      }
      else {
        local_358 = this_00;
        cbtTransform::inverse(this_00);
        cVar1 = (rayFromTrans->m_origin).m_floats[0];
        fVar18 = (rayFromTrans->m_origin).m_floats[1];
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * local_2f0.m_floats[1])),
                                  ZEXT416((uint)cVar1),ZEXT416((uint)local_2f0.m_floats[0]));
        cVar2 = (rayFromTrans->m_origin).m_floats[2];
        auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar2),ZEXT416((uint)local_2f0.m_floats[2]))
        ;
        auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_2e0._4_4_ * fVar18)),ZEXT416((uint)cVar1),
                                  ZEXT416((uint)local_2e0));
        auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar2),ZEXT416((uint)uStack_2d8));
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_2cc * fVar18)),ZEXT416((uint)local_2d0),
                                  ZEXT416((uint)cVar1));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416(local_2c8),ZEXT416((uint)cVar2));
        auVar20 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ + local_2c0)),
                                ZEXT416((uint)(auVar19._0_4_ + local_2bc)),0x10);
        local_340.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar20,ZEXT416((uint)(local_2b8 + auVar21._0_4_)),0x28);
        cVar1 = (rayToTrans->m_origin).m_floats[0];
        fVar18 = (rayToTrans->m_origin).m_floats[1];
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(local_2f0.m_floats[1] * fVar18)),
                                  ZEXT416((uint)cVar1),ZEXT416((uint)local_2f0.m_floats[0]));
        cVar2 = (rayToTrans->m_origin).m_floats[2];
        auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar2),ZEXT416((uint)local_2f0.m_floats[2]))
        ;
        auVar19 = vfmadd231ss_fma(ZEXT416((uint)(local_2e0._4_4_ * fVar18)),ZEXT416((uint)cVar1),
                                  ZEXT416((uint)local_2e0));
        auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)cVar2),ZEXT416((uint)uStack_2d8));
        auVar21 = vfmadd231ss_fma(ZEXT416((uint)(local_2cc * fVar18)),ZEXT416((uint)cVar1),
                                  ZEXT416((uint)local_2d0));
        auVar21 = vfmadd231ss_fma(auVar21,ZEXT416((uint)cVar2),ZEXT416(local_2c8));
        auVar20 = vinsertps_avx(ZEXT416((uint)(local_2c0 + auVar20._0_4_)),
                                ZEXT416((uint)(local_2bc + auVar19._0_4_)),0x10);
        local_350.m_floats =
             (cbtScalar  [4])vinsertps_avx(auVar20,ZEXT416((uint)(local_2b8 + auVar21._0_4_)),0x28);
        pcVar8 = collisionObjectWrap->m_collisionObject;
        cbtTriangleRaycastCallback::cbtTriangleRaycastCallback
                  ((cbtTriangleRaycastCallback *)local_1e0,&local_340,&local_350,
                   resultCallback->m_flags);
        cVar12.m_floats = local_340.m_floats;
        local_1e0._0_8_ = &PTR__cbtTriangleCallback_00b6fd88;
        local_198._0_8_ = *(undefined8 *)(local_358->m_basis).m_el[0].m_floats;
        local_198[2] = (local_358->m_basis).m_el[0].m_floats[2];
        local_198[3] = (local_358->m_basis).m_el[0].m_floats[3];
        local_188 = *(cbtScalar (*) [2])(local_358->m_basis).m_el[1].m_floats;
        cStack_180.m_floats._0_8_ = *(undefined8 *)((local_358->m_basis).m_el[1].m_floats + 2);
        cStack_180.m_floats._8_8_ = *(undefined8 *)(local_358->m_basis).m_el[2].m_floats;
        cStack_170.m_floats._0_8_ = *(undefined8 *)((local_358->m_basis).m_el[2].m_floats + 2);
        cStack_170.m_floats._8_8_ = *(undefined8 *)(local_358->m_origin).m_floats;
        acStack_160[0].m_floats._0_8_ = *(undefined8 *)((local_358->m_origin).m_floats + 2);
        local_1b8 = (cbtTransform *)
                    CONCAT44(resultCallback->m_closestHitFraction,(cbtScalar)local_1b8);
        local_368 = local_340.m_floats[0];
        fStack_364 = local_340.m_floats[1];
        uVar13 = _local_368;
        fStack_360 = local_340.m_floats[2];
        fStack_35c = local_340.m_floats[3];
        uVar14 = _fStack_360;
        local_368 = cVar12.m_floats[0];
        fVar18 = local_368;
        fStack_364 = cVar12.m_floats[1];
        fVar3 = fStack_364;
        if (local_350.m_floats[0] < local_368) {
          local_368 = local_350.m_floats[0];
          uVar13 = _local_368;
        }
        _local_368 = uVar13;
        if (local_350.m_floats[1] < fStack_364) {
          fStack_364 = local_350.m_floats[1];
        }
        fStack_360 = cVar12.m_floats[2];
        fVar4 = fStack_360;
        fStack_35c = cVar12.m_floats[3];
        fVar5 = fStack_35c;
        if (local_350.m_floats[2] < fStack_360) {
          fStack_360 = local_350.m_floats[2];
          uVar14 = _fStack_360;
        }
        _fStack_360 = uVar14;
        if (local_350.m_floats[3] < fStack_35c) {
          fStack_35c = local_350.m_floats[3];
        }
        local_378 = local_340.m_floats[0];
        cStack_374 = local_340.m_floats[1];
        fStack_370 = local_340.m_floats[2];
        cStack_36c = local_340.m_floats[3];
        if (fVar18 < local_350.m_floats[0]) {
          cStack_374 = fVar3;
          local_378 = local_350.m_floats[0];
        }
        if (cStack_374 < local_350.m_floats[1]) {
          cStack_374 = local_350.m_floats[1];
        }
        if (fVar4 < local_350.m_floats[2]) {
          cStack_36c = fVar5;
          fStack_370 = local_350.m_floats[2];
        }
        if (cStack_36c < local_350.m_floats[3]) {
          cStack_36c = local_350.m_floats[3];
        }
        local_340.m_floats = cVar12.m_floats;
        local_1b0 = resultCallback;
        local_1a8 = pcVar8;
        (*(((cbtTriangleMeshShape *)&this->super_cbtCollisionShape)->super_cbtConcaveShape).
          super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
                  (this,local_1e0,&local_368,&local_378);
      }
    }
    cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)local_1e0);
  }
  else if (iVar15 == 0x25) {
    local_1e0._8_8_ = collisionObjectWrap->m_collisionObject;
    local_1e0._0_8_ = &PTR__ICollide_00b6fdd0;
    local_1d0 = this;
    local_1c8 = this_00;
    local_1c0 = rayFromTrans;
    local_1b8 = rayToTrans;
    if (this->m_dynamicAabbTree == (cbtDbvt *)0x0) {
      iVar15 = (this->m_children).m_size;
      local_1b0 = resultCallback;
      if (0 < iVar15) {
        i = 0;
        do {
          rayTestSingleInternal::RayTester::ProcessLeaf((RayTester *)local_1e0,i);
          i = i + 1;
        } while (iVar15 != i);
      }
    }
    else {
      fVar18 = (this_00->m_origin).m_floats[0];
      fVar9 = (rayFromTrans->m_origin).m_floats[0] - fVar18;
      fVar3 = (this_00->m_origin).m_floats[1];
      fVar10 = (rayFromTrans->m_origin).m_floats[1] - fVar3;
      fVar4 = (this_00->m_origin).m_floats[2];
      fVar11 = (rayFromTrans->m_origin).m_floats[2] - fVar4;
      fVar5 = (this_00->m_basis).m_el[1].m_floats[0];
      fVar6 = (this_00->m_basis).m_el[1].m_floats[1];
      fVar7 = (this_00->m_basis).m_el[1].m_floats[2];
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar5)),ZEXT416((uint)fVar9),
                                ZEXT416((uint)(this_00->m_basis).m_el[0].m_floats[0]));
      auVar21 = ZEXT416((uint)(this_00->m_basis).m_el[2].m_floats[0]);
      auVar20 = vfmadd231ss_fma(auVar20,auVar21,ZEXT416((uint)fVar11));
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar10)),ZEXT416((uint)fVar9),
                                ZEXT416((uint)(this_00->m_basis).m_el[0].m_floats[1]));
      auVar22 = ZEXT416((uint)(this_00->m_basis).m_el[2].m_floats[1]);
      auVar19 = vfmadd231ss_fma(auVar19,auVar22,ZEXT416((uint)fVar11));
      auVar20 = vinsertps_avx(auVar20,auVar19,0x10);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar10)),ZEXT416((uint)fVar9),
                                ZEXT416((uint)(this_00->m_basis).m_el[0].m_floats[2]));
      auVar23 = ZEXT416((uint)(this_00->m_basis).m_el[2].m_floats[2]);
      auVar19 = vfmadd231ss_fma(auVar19,auVar23,ZEXT416((uint)fVar11));
      local_2a8.m_floats = (cbtScalar  [4])vinsertps_avx(auVar20,auVar19,0x28);
      fVar18 = (rayToTrans->m_origin).m_floats[0] - fVar18;
      fVar3 = (rayToTrans->m_origin).m_floats[1] - fVar3;
      fVar4 = (rayToTrans->m_origin).m_floats[2] - fVar4;
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar3)),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(this_00->m_basis).m_el[0].m_floats[0]));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar4),auVar21);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar3)),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(this_00->m_basis).m_el[0].m_floats[1]));
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar4),auVar22);
      auVar20 = vinsertps_avx(auVar20,auVar19,0x10);
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar3)),ZEXT416((uint)fVar18),
                                ZEXT416((uint)(this_00->m_basis).m_el[0].m_floats[2]));
      auVar19 = vfmadd231ss_fma(auVar19,auVar23,ZEXT416((uint)fVar4));
      local_2f0.m_floats = (cbtScalar  [4])vinsertps_avx(auVar20,auVar19,0x28);
      local_1b0 = resultCallback;
      cbtDbvt::rayTest(this->m_dynamicAabbTree->m_root,&local_2a8,&local_2f0,(ICollide *)local_1e0);
    }
  }
  cbtConvexShape::~cbtConvexShape(&local_78.super_cbtConvexShape);
  return;
}

Assistant:

void cbtCollisionWorld::rayTestSingleInternal(const cbtTransform& rayFromTrans, const cbtTransform& rayToTrans,
											 const cbtCollisionObjectWrapper* collisionObjectWrap,
											 RayResultCallback& resultCallback)
{
	cbtSphereShape pointShape(cbtScalar(0.0));
	pointShape.setMargin(0.f);
	const cbtConvexShape* castShape = &pointShape;
	const cbtCollisionShape* collisionShape = collisionObjectWrap->getCollisionShape();
	const cbtTransform& colObjWorldTransform = collisionObjectWrap->getWorldTransform();

	if (collisionShape->isConvex())
	{
		//		BT_PROFILE("rayTestConvex");
		cbtConvexCast::CastResult castResult;
		castResult.m_fraction = resultCallback.m_closestHitFraction;

		cbtConvexShape* convexShape = (cbtConvexShape*)collisionShape;
		cbtVoronoiSimplexSolver simplexSolver;
		cbtSubsimplexConvexCast subSimplexConvexCaster(castShape, convexShape, &simplexSolver);

		cbtGjkConvexCast gjkConvexCaster(castShape, convexShape, &simplexSolver);

		//cbtContinuousConvexCollision convexCaster(castShape,convexShape,&simplexSolver,0);

		cbtConvexCast* convexCasterPtr = 0;
		//use kF_UseSubSimplexConvexCastRaytest by default
		if (resultCallback.m_flags & cbtTriangleRaycastCallback::kF_UseGjkConvexCastRaytest)
			convexCasterPtr = &gjkConvexCaster;
		else
			convexCasterPtr = &subSimplexConvexCaster;

		cbtConvexCast& convexCaster = *convexCasterPtr;

		if (convexCaster.calcTimeOfImpact(rayFromTrans, rayToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
		{
			//add hit
			if (castResult.m_normal.length2() > cbtScalar(0.0001))
			{
				if (castResult.m_fraction < resultCallback.m_closestHitFraction)
				{
					//todo: figure out what this is about. When is rayFromTest.getBasis() not identity?
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
					//rotate normal into worldspace
					castResult.m_normal = rayFromTrans.getBasis() * castResult.m_normal;
#endif  //USE_SUBSIMPLEX_CONVEX_CAST

					castResult.m_normal.normalize();
					cbtCollisionWorld::LocalRayResult localRayResult(
						collisionObjectWrap->getCollisionObject(),
						0,
						castResult.m_normal,
						castResult.m_fraction);

					bool normalInWorldSpace = true;
					resultCallback.addSingleResult(localRayResult, normalInWorldSpace);
				}
			}
		}
	}
	else
	{
		if (collisionShape->isConcave())
		{
			//ConvexCast::CastResult
			struct BridgeTriangleRaycastCallback : public cbtTriangleRaycastCallback
			{
				cbtCollisionWorld::RayResultCallback* m_resultCallback;
				const cbtCollisionObject* m_collisionObject;
				const cbtConcaveShape* m_triangleMesh;

				cbtTransform m_colObjWorldTransform;

				BridgeTriangleRaycastCallback(const cbtVector3& from, const cbtVector3& to,
											  cbtCollisionWorld::RayResultCallback* resultCallback, const cbtCollisionObject* collisionObject, const cbtConcaveShape* triangleMesh, const cbtTransform& colObjWorldTransform) :  //@BP Mod
																																																							cbtTriangleRaycastCallback(from, to, resultCallback->m_flags),
																																																							m_resultCallback(resultCallback),
																																																							m_collisionObject(collisionObject),
																																																							m_triangleMesh(triangleMesh),
																																																							m_colObjWorldTransform(colObjWorldTransform)
				{
				}

				virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, cbtScalar hitFraction, int partId, int triangleIndex)
				{
					cbtCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = partId;
					shapeInfo.m_triangleIndex = triangleIndex;

					cbtVector3 hitNormalWorld = m_colObjWorldTransform.getBasis() * hitNormalLocal;

					cbtCollisionWorld::LocalRayResult rayResult(m_collisionObject,
															   &shapeInfo,
															   hitNormalWorld,
															   hitFraction);

					bool normalInWorldSpace = true;
					return m_resultCallback->addSingleResult(rayResult, normalInWorldSpace);
				}
			};

			cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
			cbtVector3 rayFromLocal = worldTocollisionObject * rayFromTrans.getOrigin();
			cbtVector3 rayToLocal = worldTocollisionObject * rayToTrans.getOrigin();

			//			BT_PROFILE("rayTestConcave");
			if (collisionShape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				///optimized version for cbtBvhTriangleMeshShape
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)collisionShape;

				BridgeTriangleRaycastCallback rcb(rayFromLocal, rayToLocal, &resultCallback, collisionObjectWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;
				triangleMesh->performRaycast(&rcb, rayFromLocal, rayToLocal);
			}
			else if (collisionShape->getShapeType() == SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				///optimized version for cbtScaledBvhTriangleMeshShape
				cbtScaledBvhTriangleMeshShape* scaledTriangleMesh = (cbtScaledBvhTriangleMeshShape*)collisionShape;
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)scaledTriangleMesh->getChildShape();

				//scale the ray positions
				cbtVector3 scale = scaledTriangleMesh->getLocalScaling();
				cbtVector3 rayFromLocalScaled = rayFromLocal / scale;
				cbtVector3 rayToLocalScaled = rayToLocal / scale;

				//perform raycast in the underlying cbtBvhTriangleMeshShape
				BridgeTriangleRaycastCallback rcb(rayFromLocalScaled, rayToLocalScaled, &resultCallback, collisionObjectWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;
				triangleMesh->performRaycast(&rcb, rayFromLocalScaled, rayToLocalScaled);
			}
			else
			{
				//generic (slower) case
				cbtConcaveShape* concaveShape = (cbtConcaveShape*)collisionShape;

				cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();

				cbtVector3 rayFromLocal = worldTocollisionObject * rayFromTrans.getOrigin();
				cbtVector3 rayToLocal = worldTocollisionObject * rayToTrans.getOrigin();

				//ConvexCast::CastResult

				struct BridgeTriangleRaycastCallback : public cbtTriangleRaycastCallback
				{
					cbtCollisionWorld::RayResultCallback* m_resultCallback;
					const cbtCollisionObject* m_collisionObject;
					cbtConcaveShape* m_triangleMesh;

					cbtTransform m_colObjWorldTransform;

					BridgeTriangleRaycastCallback(const cbtVector3& from, const cbtVector3& to,
												  cbtCollisionWorld::RayResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtConcaveShape* triangleMesh, const cbtTransform& colObjWorldTransform) :  //@BP Mod
																																																						  cbtTriangleRaycastCallback(from, to, resultCallback->m_flags),
																																																						  m_resultCallback(resultCallback),
																																																						  m_collisionObject(collisionObject),
																																																						  m_triangleMesh(triangleMesh),
																																																						  m_colObjWorldTransform(colObjWorldTransform)
					{
					}

					virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, cbtScalar hitFraction, int partId, int triangleIndex)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;

						cbtVector3 hitNormalWorld = m_colObjWorldTransform.getBasis() * hitNormalLocal;

						cbtCollisionWorld::LocalRayResult rayResult(m_collisionObject,
																   &shapeInfo,
																   hitNormalWorld,
																   hitFraction);

						bool normalInWorldSpace = true;
						return m_resultCallback->addSingleResult(rayResult, normalInWorldSpace);
					}
				};

				BridgeTriangleRaycastCallback rcb(rayFromLocal, rayToLocal, &resultCallback, collisionObjectWrap->getCollisionObject(), concaveShape, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;

				cbtVector3 rayAabbMinLocal = rayFromLocal;
				rayAabbMinLocal.setMin(rayToLocal);
				cbtVector3 rayAabbMaxLocal = rayFromLocal;
				rayAabbMaxLocal.setMax(rayToLocal);

				concaveShape->processAllTriangles(&rcb, rayAabbMinLocal, rayAabbMaxLocal);
			}
		}
		else
		{
			//			BT_PROFILE("rayTestCompound");
			if (collisionShape->isCompound())
			{
				struct LocalInfoAdder2 : public RayResultCallback
				{
					RayResultCallback* m_userCallback;
					int m_i;

					LocalInfoAdder2(int i, RayResultCallback* user)
						: m_userCallback(user), m_i(i)
					{
						m_closestHitFraction = m_userCallback->m_closestHitFraction;
						m_flags = m_userCallback->m_flags;
					}
					virtual bool needsCollision(cbtBroadphaseProxy* p) const
					{
						return m_userCallback->needsCollision(p);
					}

					virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalRayResult& r, bool b)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = -1;
						shapeInfo.m_triangleIndex = m_i;
						if (r.m_localShapeInfo == NULL)
							r.m_localShapeInfo = &shapeInfo;

						const cbtScalar result = m_userCallback->addSingleResult(r, b);
						m_closestHitFraction = m_userCallback->m_closestHitFraction;
						return result;
					}
				};

				struct RayTester : cbtDbvt::ICollide
				{
					const cbtCollisionObject* m_collisionObject;
					const cbtCompoundShape* m_compoundShape;
					const cbtTransform& m_colObjWorldTransform;
					const cbtTransform& m_rayFromTrans;
					const cbtTransform& m_rayToTrans;
					RayResultCallback& m_resultCallback;

					RayTester(const cbtCollisionObject* collisionObject,
							  const cbtCompoundShape* compoundShape,
							  const cbtTransform& colObjWorldTransform,
							  const cbtTransform& rayFromTrans,
							  const cbtTransform& rayToTrans,
							  RayResultCallback& resultCallback) : m_collisionObject(collisionObject),
																   m_compoundShape(compoundShape),
																   m_colObjWorldTransform(colObjWorldTransform),
																   m_rayFromTrans(rayFromTrans),
																   m_rayToTrans(rayToTrans),
																   m_resultCallback(resultCallback)
					{
					}

					void ProcessLeaf(int i)
					{
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(i);
						const cbtTransform& childTrans = m_compoundShape->getChildTransform(i);
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						cbtCollisionObjectWrapper tmpOb(0, childCollisionShape, m_collisionObject, childWorldTrans, -1, i);
						// replace collision shape so that callback can determine the triangle

						LocalInfoAdder2 my_cb(i, &m_resultCallback);

						rayTestSingleInternal(
							m_rayFromTrans,
							m_rayToTrans,
							&tmpOb,
							my_cb);
					}

					void Process(const cbtDbvtNode* leaf)
					{
						ProcessLeaf(leaf->dataAsInt);
					}
				};

				const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(collisionShape);
				const cbtDbvt* dbvt = compoundShape->getDynamicAabbTree();

				RayTester rayCB(
					collisionObjectWrap->getCollisionObject(),
					compoundShape,
					colObjWorldTransform,
					rayFromTrans,
					rayToTrans,
					resultCallback);
#ifndef DISABLE_DBVT_COMPOUNDSHAPE_RAYCAST_ACCELERATION
				if (dbvt)
				{
					cbtVector3 localRayFrom = colObjWorldTransform.inverseTimes(rayFromTrans).getOrigin();
					cbtVector3 localRayTo = colObjWorldTransform.inverseTimes(rayToTrans).getOrigin();
					cbtDbvt::rayTest(dbvt->m_root, localRayFrom, localRayTo, rayCB);
				}
				else
#endif  //DISABLE_DBVT_COMPOUNDSHAPE_RAYCAST_ACCELERATION
				{
					for (int i = 0, n = compoundShape->getNumChildShapes(); i < n; ++i)
					{
						rayCB.ProcessLeaf(i);
					}
				}
			}
		}
	}
}